

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_mapper.h
# Opt level: O0

uint8_t MMC1_read(nes_cartridge *cartridge,uint16_t address)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  ulong local_30;
  size_t prg_address;
  mmc1_mapper_state *state;
  uint16_t address_local;
  nes_cartridge *cartridge_local;
  
  pbVar1 = (byte *)cartridge->mapper_state;
  if ((0x5fff < address) && (address < 0x8000)) {
    return pbVar1[(long)(int)(address - 0x6000) + 0x32];
  }
  local_30 = *(ulong *)(pbVar1 + 8);
  bVar2 = *pbVar1 & 3;
  if (1 < bVar2) {
    if (bVar2 == 2) {
      if (address < 0xc000) {
        uVar3 = *(long *)(pbVar1 + 0x10) + (long)(int)(address - 0x8000);
      }
      else {
        uVar3 = *(long *)(pbVar1 + 0x18) + (long)(int)(address - 0xc000);
      }
      local_30 = uVar3 | local_30;
      goto LAB_00104b96;
    }
    if (bVar2 == 3) {
      if (address < 0xc000) {
        uVar3 = *(long *)(pbVar1 + 0x18) + (long)(int)(address - 0x8000);
      }
      else {
        uVar3 = *(long *)(pbVar1 + 0x10) + (long)(int)(address - 0xc000);
      }
      local_30 = uVar3 | local_30;
      goto LAB_00104b96;
    }
  }
  local_30 = *(long *)(pbVar1 + 0x18) + (long)(int)(address - 0x8000) | local_30;
LAB_00104b96:
  return cartridge->prg_rom[local_30];
}

Assistant:

static uint8_t MMC1_read(nes_cartridge* cartridge, uint16_t address)
{
    mmc1_mapper_state* state = (mmc1_mapper_state*)cartridge->mapper_state;

    if (address >= 0x6000 && address <= 0x7FFF)
        return state->ram[address - 0x6000];

    size_t prg_address = state->prg_bank_selector;
    switch (state->bank_mode)
    {
        default:
        case 0: case 1:             prg_address |= state->current_bank_offset + (address - 0x8000); 
        break;
        case 2:
            if (address >= 0xC000)  prg_address |= state->current_bank_offset + (address - 0xC000);
            else                    prg_address |= state->fixed_bank_offset + (address - 0x8000);
        break;
        case 3:
            if (address >= 0xC000)  prg_address |= state->fixed_bank_offset + (address - 0xC000);
            else                    prg_address |= state->current_bank_offset + (address - 0x8000);
        break;
    }

    return cartridge->prg_rom[prg_address];
}